

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSim.c
# Opt level: O0

int Gia_ManSimSimulate(Gia_Man_t *pAig,Gia_ParSim_t *pPars)

{
  long lVar1;
  long lVar2;
  long lVar3;
  undefined8 uVar4;
  long lVar5;
  int iVar6;
  abctime aVar7;
  Abc_Cex_t *pAVar8;
  long local_50;
  abctime nTimeToStop;
  int RetValue;
  int iPat;
  int iOut;
  int i;
  abctime clkTotal;
  Gia_ManSim_t *p;
  Gia_ParSim_t *pPars_local;
  Gia_Man_t *pAig_local;
  
  p = (Gia_ManSim_t *)pPars;
  pPars_local = (Gia_ParSim_t *)pAig;
  _iOut = Abc_Clock();
  nTimeToStop._0_4_ = 0;
  if (*(int *)((long)&p->pPars + 4) == 0) {
    local_50 = 0;
  }
  else {
    iVar6 = *(int *)((long)&p->pPars + 4);
    aVar7 = Abc_Clock();
    local_50 = (long)iVar6 * 1000000 + aVar7;
  }
  lVar1._0_4_ = pPars_local[5].nIters;
  lVar1._4_4_ = pPars_local[5].RandSeed;
  if ((lVar1 == 0) ||
     (lVar2._0_4_ = pPars_local[5].TimeLimit, lVar2._4_4_ = pPars_local[5].fCheckMiter, lVar2 == 0))
  {
    lVar3._0_4_ = pPars_local[9].fVerbose;
    lVar3._4_4_ = pPars_local[9].iOutFail;
    if (lVar3 != 0) {
      free(*(void **)&pPars_local[9].fVerbose);
      pPars_local[9].fVerbose = 0;
      pPars_local[9].iOutFail = 0;
    }
    clkTotal = (abctime)Gia_ManSimCreate((Gia_Man_t *)pPars_local,(Gia_ParSim_t *)p);
    Gia_ManResetRandom((Gia_ParSim_t *)p);
    Gia_ManSimInfoInit((Gia_ManSim_t *)clkTotal);
    for (iPat = 0; iPat < *(int *)((long)&p->pAig + 4); iPat = iPat + 1) {
      Gia_ManSimulateRound((Gia_ManSim_t *)clkTotal);
      if (*(int *)&p->field_0x14 != 0) {
        Abc_Print(1,"Frame %4d out of %4d and timeout %3d sec. ",(ulong)(iPat + 1),
                  (ulong)*(uint *)((long)&p->pAig + 4),(ulong)*(uint *)((long)&p->pPars + 4));
        aVar7 = Abc_Clock();
        Abc_Print(1,"Time = %7.2f sec\r",((double)aVar7 + -(double)_iOut) / 1000000.0);
      }
      if ((p->nWords != 0) &&
         (iVar6 = Gia_ManCheckPos((Gia_ManSim_t *)clkTotal,&RetValue,(int *)((long)&nTimeToStop + 4)
                                 ), iVar6 != 0)) {
        Gia_ManResetRandom((Gia_ParSim_t *)p);
        *(int *)&p->vCis2Ids = RetValue;
        pAVar8 = Gia_ManGenerateCounter
                           ((Gia_Man_t *)pPars_local,iPat,RetValue,*(int *)(clkTotal + 0x10),
                            nTimeToStop._4_4_,*(Vec_Int_t **)(clkTotal + 0x18));
        *(Abc_Cex_t **)&pPars_local[9].fVerbose = pAVar8;
        uVar4._0_4_ = pPars_local->nWords;
        uVar4._4_4_ = pPars_local->nIters;
        Abc_Print(1,"Output %d of miter \"%s\" was asserted in frame %d.  ",(ulong)(uint)RetValue,
                  uVar4,(ulong)(uint)iPat);
        iVar6 = Gia_ManVerifyCex((Gia_Man_t *)pPars_local,*(Abc_Cex_t **)&pPars_local[9].fVerbose,0)
        ;
        if (iVar6 == 0) {
          Abc_Print(1,"\nGenerated counter-example is INVALID.                    ");
        }
        nTimeToStop._0_4_ = 1;
        break;
      }
      aVar7 = Abc_Clock();
      if (local_50 < aVar7) {
        iPat = iPat + 1;
        break;
      }
      if (iPat < *(int *)((long)&p->pAig + 4) + -1) {
        Gia_ManSimInfoTransfer((Gia_ManSim_t *)clkTotal);
      }
    }
    Gia_ManSimDelete((Gia_ManSim_t *)clkTotal);
    lVar5._0_4_ = pPars_local[9].fVerbose;
    lVar5._4_4_ = pPars_local[9].iOutFail;
    if (lVar5 == 0) {
      Abc_Print(1,"No bug detected after simulating %d frames with %d words.  ",(ulong)(uint)iPat,
                (ulong)*(uint *)&p->pAig);
    }
    aVar7 = Abc_Clock();
    Abc_PrintTime(1,"Time",aVar7 - _iOut);
    pAig_local._4_4_ = (int)nTimeToStop;
  }
  else {
    pAig_local._4_4_ = Gia_ManSimSimulateEquiv((Gia_Man_t *)pPars_local,(Gia_ParSim_t *)p);
  }
  return pAig_local._4_4_;
}

Assistant:

int Gia_ManSimSimulate( Gia_Man_t * pAig, Gia_ParSim_t * pPars )
{
    extern int Gia_ManSimSimulateEquiv( Gia_Man_t * pAig, Gia_ParSim_t * pPars );
    Gia_ManSim_t * p;
    abctime clkTotal = Abc_Clock();
    int i, iOut, iPat, RetValue = 0;
    abctime nTimeToStop = pPars->TimeLimit ? pPars->TimeLimit * CLOCKS_PER_SEC + Abc_Clock(): 0;
    if ( pAig->pReprs && pAig->pNexts )
        return Gia_ManSimSimulateEquiv( pAig, pPars );
    ABC_FREE( pAig->pCexSeq );
    p = Gia_ManSimCreate( pAig, pPars );
    Gia_ManResetRandom( pPars );
    Gia_ManSimInfoInit( p );
    for ( i = 0; i < pPars->nIters; i++ )
    {
        Gia_ManSimulateRound( p );
        if ( pPars->fVerbose )
        {
            Abc_Print( 1, "Frame %4d out of %4d and timeout %3d sec. ", i+1, pPars->nIters, pPars->TimeLimit );
            Abc_Print( 1, "Time = %7.2f sec\r", (1.0*Abc_Clock()-clkTotal)/CLOCKS_PER_SEC );
        }
        if ( pPars->fCheckMiter && Gia_ManCheckPos( p, &iOut, &iPat ) )
        {
            Gia_ManResetRandom( pPars );
            pPars->iOutFail = iOut;
            pAig->pCexSeq = Gia_ManGenerateCounter( pAig, i, iOut, p->nWords, iPat, p->vCis2Ids );
            Abc_Print( 1, "Output %d of miter \"%s\" was asserted in frame %d.  ", iOut, pAig->pName, i );
            if ( !Gia_ManVerifyCex( pAig, pAig->pCexSeq, 0 ) )
            {
//                Abc_Print( 1, "\n" );
                Abc_Print( 1, "\nGenerated counter-example is INVALID.                    " );
//                Abc_Print( 1, "\n" );
            }
            else
            {
//                Abc_Print( 1, "\n" );
//                if ( pPars->fVerbose )
//                Abc_Print( 1, "\nGenerated counter-example is verified correctly.         " );
//                Abc_Print( 1, "\n" );
            }
            RetValue = 1;
            break;
        }
        if ( Abc_Clock() > nTimeToStop )
        {
            i++;
            break;
        }
        if ( i < pPars->nIters - 1 )
            Gia_ManSimInfoTransfer( p );
    }
    Gia_ManSimDelete( p );
    if ( pAig->pCexSeq == NULL )
        Abc_Print( 1, "No bug detected after simulating %d frames with %d words.  ", i, pPars->nWords );
    Abc_PrintTime( 1, "Time", Abc_Clock() - clkTotal );
    return RetValue;
}